

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O1

bool __thiscall FDrawInfo::DoFakeCeilingBridge(FDrawInfo *this,subsector_t *subsec,float Planez)

{
  double dVar1;
  uint uVar2;
  seg_t *psVar3;
  subsector_t *subsec_00;
  bool bVar4;
  char cVar5;
  sector_t *psVar6;
  ulong uVar7;
  uint uVar8;
  seg_t *psVar9;
  long lVar10;
  bool bVar11;
  
  uVar2 = subsec->numlines;
  bVar11 = uVar2 != 0;
  if (bVar11) {
    psVar3 = subsec->firstline;
    if (psVar3->backsector != (sector_t *)0x0) {
      uVar8 = 1;
      psVar9 = psVar3;
      do {
        if (psVar9->PartnerSeg == (seg_t *)0x0) break;
        if (uVar2 == uVar8) goto LAB_00448151;
        bVar11 = uVar8 < uVar2;
        psVar9 = psVar3 + uVar8;
        uVar8 = uVar8 + 1;
      } while (psVar9->backsector != (sector_t *)0x0);
    }
    if (bVar11) {
      return false;
    }
  }
LAB_00448151:
  bVar11 = subsec->numlines != 0;
  if (bVar11) {
    lVar10 = 0x30;
    uVar7 = 0;
    do {
      psVar3 = subsec->firstline;
      subsec_00 = *(subsector_t **)(*(long *)((long)&psVar3->v1 + lVar10) + 0x38);
      cVar5 = '\a';
      if (subsec_00->validcount != validcount) {
        subsec_00->validcount = validcount;
        psVar6 = *(sector_t **)((long)psVar3 + lVar10 + -8);
        if ((*(sector_t **)((long)psVar3 + lVar10 + -0x10) != psVar6) &&
           (*(long *)((long)psVar3 + lVar10 + -0x18) != 0)) {
          psVar6 = gl_FakeFlat(psVar6,&fakesec,in_area,true);
          if (((psVar6->ceilingplane).normal.Y != 0.0 || (psVar6->ceilingplane).normal.X != 0.0) ||
             (dVar1 = psVar6->planes[1].TexZ, (double)Planez < dVar1)) {
            bVar4 = false;
            cVar5 = '\x01';
          }
          else {
            bVar4 = dVar1 != (double)Planez;
            cVar5 = '\a';
            if (bVar4) {
              cVar5 = '\0';
            }
          }
          if (!bVar4) goto LAB_00448241;
        }
        bVar4 = DoFakeCeilingBridge(this,subsec_00,Planez);
        cVar5 = !bVar4;
      }
LAB_00448241:
      if ((cVar5 != '\a') && (cVar5 != '\0')) {
        if (bVar11) {
          return false;
        }
        break;
      }
      uVar7 = uVar7 + 1;
      lVar10 = lVar10 + 0x48;
      bVar11 = uVar7 < subsec->numlines;
    } while (bVar11);
  }
  TArray<subsector_t_*,_subsector_t_*>::Grow(&this->HandledSubsectors,1);
  uVar2 = (this->HandledSubsectors).Count;
  (this->HandledSubsectors).Array[uVar2] = subsec;
  (this->HandledSubsectors).Count = uVar2 + 1;
  return true;
}

Assistant:

bool FDrawInfo::DoFakeCeilingBridge(subsector_t * subsec, float Planez)
{
	// Is there a one-sided wall in this sector?
	// Do this first to avoid unnecessary recursion
	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		if (subsec->firstline[i].backsector == NULL) return false;
		if (subsec->firstline[i].PartnerSeg == NULL) return false;
	}

	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		seg_t * seg = subsec->firstline + i;
		subsector_t * backsub = seg->PartnerSeg->Subsector;

		// already checked?
		if (backsub->validcount == validcount) continue;
		backsub->validcount = validcount;

		if (seg->frontsector != seg->backsector && seg->linedef)
		{
			// Note: if this is a real line between sectors
			// we can be sure that render_sector is the real sector!

			sector_t * sec = gl_FakeFlat(seg->backsector, &fakesec, true);

			// Don't bother with slopes
			if (sec->ceilingplane.isSlope())  return false;

			// Is the neighboring ceiling higher than the desired height?
			if (sec->GetPlaneTexZ(sector_t::ceiling) > Planez)
			{
				// todo: check for missing textures.
				return false;
			}

			// This is an exact height match which means we don't have to do any further checks for this sector
			// No texture checks though! 
			if (sec->GetPlaneTexZ(sector_t::ceiling) == Planez) continue;
		}
		if (!DoFakeCeilingBridge(backsub, Planez)) return false;
	}
	// all checked ok. This sector is part of the current fake plane

	HandledSubsectors.Push(subsec);
	return 1;
}